

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O2

void __thiscall hwnet::TCPSocket::checkTimeout(TCPSocket *this,Ptr *t)

{
  element_type *peVar1;
  long lVar2;
  undefined1 local_60 [8];
  SendTimeoutCallback cb;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)local_60,&this->timer);
  peVar1 = (t->super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cb);
  if ((undefined1  [8])peVar1 == local_60) {
    if ((((((this->closed)._M_base._M_i & 1U) == 0) && (this->sendTimeout != 0)) &&
        ((this->sendTimeoutCallback_).super__Function_base._M_manager != (_Manager_type)0x0)) &&
       (this->ptrSendlist->head != (sendContext *)0x0)) {
      lVar2 = std::chrono::_V2::steady_clock::now();
      if (this->sendTimeout * 1000000 < (ulong)(lVar2 - (this->lastSendTime).__d.__r)) {
        std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::function
                  ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)local_60,
                   &this->sendTimeoutCallback_);
        this->sendTimeout = 0;
        std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator=
                  (&this->sendTimeoutCallback_,(nullptr_t)0x0);
        pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
        std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<hwnet::TCPSocket,void>
                  ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)&cb._M_invoker,
                   (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<hwnet::TCPSocket>);
        std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator()
                  ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)local_60,
                   (shared_ptr<hwnet::TCPSocket> *)&cb._M_invoker);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
        std::mutex::lock(&this->mtx);
        std::_Function_base::~_Function_base((_Function_base *)local_60);
      }
    }
    if (((((this->closed)._M_base._M_i & 1U) == 0) && (this->recvTimeout != 0)) &&
       (((this->recvTimeoutCallback_).super__Function_base._M_manager != (_Manager_type)0x0 &&
        ((this->recvList).
         super__List_base<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>
         ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&this->recvList)))) {
      lVar2 = std::chrono::_V2::steady_clock::now();
      if (this->recvTimeout * 1000000 < (ulong)(lVar2 - (this->lastRecvTime).__d.__r)) {
        std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::function
                  ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)local_60,
                   &this->recvTimeoutCallback_);
        this->recvTimeout = 0;
        std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator=
                  (&this->recvTimeoutCallback_,(nullptr_t)0x0);
        pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
        std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<hwnet::TCPSocket,void>
                  ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)&cb._M_invoker,
                   (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<hwnet::TCPSocket>);
        std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator()
                  ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)local_60,
                   (shared_ptr<hwnet::TCPSocket> *)&cb._M_invoker);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
        std::mutex::lock(&this->mtx);
        std::_Function_base::~_Function_base((_Function_base *)local_60);
      }
    }
    if (this->recvTimeout == 0 && this->sendTimeout == 0) {
      util::Timer::cancel((t->super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr);
      std::__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::reset
                (&(this->timer).super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>);
    }
  }
  return;
}

Assistant:

void TCPSocket::checkTimeout(hwnet::util::Timer::Ptr t) {

	if(t != this->timer.lock()) {
		return;
	}
		
	if(!this->closed && this->sendTimeout > 0 && 
	   this->sendTimeoutCallback_ && !this->ptrSendlist->empty() &&
	   (util::milliseconds)((std::chrono::steady_clock::now() - this->lastSendTime).count()) > this->sendTimeout*1000000) {
		SendTimeoutCallback cb = this->sendTimeoutCallback_;

		this->sendTimeout = 0;
		this->sendTimeoutCallback_ = nullptr;

		this->mtx.unlock();
		cb(shared_from_this());
		this->mtx.lock();
	}

	if(!this->closed && this->recvTimeout > 0 && 
	   this->recvTimeoutCallback_ && !this->recvListEmpty() &&
	   (util::milliseconds)((std::chrono::steady_clock::now() - this->lastRecvTime).count()) > this->recvTimeout*1000000) {
		RecvTimeoutCallback cb = this->recvTimeoutCallback_;
		
		this->recvTimeout = 0;
		this->recvTimeoutCallback_ = nullptr;

		this->mtx.unlock();
		cb(shared_from_this());
		this->mtx.lock();
	}

	if(this->sendTimeout == 0 && this->recvTimeout == 0) {
		t->cancel();
		this->timer.reset();
	}

}